

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scanner.cc
# Opt level: O3

char __thiscall mcc::Scanner::Next(Scanner *this)

{
  ErrorReporter *pEVar1;
  undefined8 uVar2;
  undefined8 this_00;
  uint uVar3;
  int iVar4;
  Token *__tmp;
  char cVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  shared_ptr<mcc::Token> token;
  undefined1 local_70 [36];
  int iStack_4c;
  undefined1 local_48 [16];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  cVar5 = this->putback_;
  if (cVar5 == '\0') {
    uVar3 = fgetc((FILE *)this->source_stream_);
    cVar5 = (char)uVar3;
    if ((uVar3 & 0xff) == 0xff) {
      return -1;
    }
    if ((uVar3 & 0xff) == 0x23) {
      do {
        GetToken((Scanner *)local_48);
        uVar2 = local_48._0_8_;
        if (*(int *)((long)&((string *)local_48._0_8_)->_M_string_length + 4) != 0x2e) {
          pEVar1 = this->reporter_;
          local_70._0_8_ = local_70 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_70,"Invalid preprocessor output","");
          ErrorReporter::Report(pEVar1,(string *)local_70,(char)uVar3,this->line_,this->c_);
          if ((ErrorReporter *)local_70._0_8_ != (ErrorReporter *)(local_70 + 0x10)) {
            operator_delete((void *)local_70._0_8_,local_70._16_8_ + 1);
          }
        }
        iVar4 = *(int *)((long)&(((string *)uVar2)->_M_dataplus)._M_p + 4);
        GetToken((Scanner *)local_70);
        this_00 = local_48._8_8_;
        this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_;
        uVar2 = local_70._0_8_;
        local_48._0_8_ = local_70._0_8_;
        local_48._8_8_ = local_70._8_8_;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00 !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
        }
        if (*(int *)(uVar2 + 0xc) != 0x2f) {
          local_38 = this_01;
          pEVar1 = this->reporter_;
          local_70._0_8_ = (ErrorReporter *)(local_70 + 0x10);
          iStack_4c = iVar4;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_70,"Invalid preprocessor output","");
          ErrorReporter::Report(pEVar1,(string *)local_70,(char)uVar3,this->line_,this->c_);
          this_01 = local_38;
          iVar4 = iStack_4c;
          if ((ErrorReporter *)local_70._0_8_ != (ErrorReporter *)(local_70 + 0x10)) {
            operator_delete((void *)local_70._0_8_,local_70._16_8_ + 1);
          }
        }
        if (**(char **)(uVar2 + 0x10) != '<') {
          std::__cxx11::string::_M_assign((string *)this->reporter_);
          this->line_ = iVar4;
        }
        do {
          iVar4 = fgetc((FILE *)this->source_stream_);
        } while ((char)iVar4 != '\n');
        uVar3 = fgetc((FILE *)this->source_stream_);
        cVar5 = (char)uVar3;
        if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
        }
      } while (cVar5 == '#');
    }
  }
  else {
    this->putback_ = '\0';
    this->c_ = this->c_ + -1;
  }
  this->c_ = this->c_ + 1;
  if (cVar5 == '\n') {
    this->line_ = this->line_ + 1;
    this->c_ = 0;
    cVar5 = '\n';
  }
  return cVar5;
}

Assistant:

char Scanner::Next() {
  char c;

  if (putback_ != '\0') {
    c = putback_;
    putback_ = '\0';
    c_--;
  } else {
    c = (char) fgetc(source_stream_);
    if (c == EOF) { // eof
      return EOF;
    }

    while (c == '#') { // preprocessor lines
      std::shared_ptr<Token> token = GetToken();
      if (token->GetType() != TokenType::T_INT_LIT)
        reporter_.Report("Invalid preprocessor output", c, line_, c_);

      int line = token->Int();

      token = GetToken();
      if (token->GetType() != TokenType::T_STR_LIT)
        reporter_.Report("Invalid preprocessor output", c, line_, c_);

      if (token->String()[0] != '<') {
        reporter_.SetFile(token->String());
        line_ = line;
      }

      while ((c = (char) fgetc(source_stream_)) != '\n');
      c = (char) fgetc(source_stream_);
    }
  }

  c_++;
  if (c == '\n') {
    line_++;
    c_ = 0;
  }

  return c;
}